

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cpp
# Opt level: O0

void NULLCFile::FileClose(File *file)

{
  File *file_local;
  
  if (file == (File *)0x0) {
    nullcThrowError("ERROR: null pointer access");
  }
  else {
    if ((file->flag & 1U) != 0) {
      fclose((FILE *)file->handle);
    }
    file->flag = 0;
    file->handle = (FILE *)0x0;
  }
  return;
}

Assistant:

void FileClose(File* file)
	{
		if(!file)
		{
			nullcThrowError("ERROR: null pointer access");
			return;
		}

		if(file->flag & FILE_OPENED)
			fclose(file->handle);

		file->flag = 0;
		file->handle = NULL;
	}